

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumper.c
# Opt level: O2

int yaml_emitter_dump(yaml_emitter_t *emitter,yaml_document_t *document)

{
  yaml_node_t *pyVar1;
  yaml_node_t *pyVar2;
  uint __line;
  int iVar3;
  yaml_anchors_t *__s;
  char *__assertion;
  yaml_event_t local_88;
  
  if (emitter == (yaml_emitter_t *)0x0) {
    __assertion = "emitter";
    __line = 0x75;
  }
  else {
    if (document != (yaml_document_t *)0x0) {
      emitter->document = document;
      if ((emitter->opened != 0) || (iVar3 = yaml_emitter_open(emitter), iVar3 != 0)) {
        pyVar1 = (document->nodes).start;
        pyVar2 = (document->nodes).top;
        if (pyVar1 == pyVar2) {
          iVar3 = yaml_emitter_close(emitter);
          if (iVar3 != 0) {
            yaml_emitter_delete_document_and_anchors(emitter);
            return 1;
          }
        }
        else {
          if (emitter->opened == 0) {
            __assert_fail("emitter->opened",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/dumper.c"
                          ,0x84,"int yaml_emitter_dump(yaml_emitter_t *, yaml_document_t *)");
          }
          __s = (yaml_anchors_t *)yaml_malloc((long)pyVar2 - (long)pyVar1 >> 3);
          emitter->anchors = __s;
          if (__s != (yaml_anchors_t *)0x0) {
            memset(__s,0,(long)(document->nodes).top - (long)(document->nodes).start >> 3);
            local_88.data._40_8_ = 0;
            local_88.data._32_8_ = 0;
            local_88.type = YAML_DOCUMENT_START_EVENT;
            local_88._4_4_ = 0;
            local_88.start_mark.index = 0;
            local_88.start_mark.line = 0;
            local_88.start_mark.column = 0;
            local_88.end_mark.index = 0;
            local_88.end_mark.line = 0;
            local_88.end_mark.column = 0;
            local_88.data.document_start.version_directive = document->version_directive;
            local_88.data.document_start.tag_directives.start = (document->tag_directives).start;
            local_88.data.document_start.tag_directives.end = (document->tag_directives).end;
            local_88.data.scalar.length._4_4_ = 0;
            local_88.data.document_start.implicit = document->start_implicit;
            iVar3 = yaml_emitter_emit(emitter,&local_88);
            if (iVar3 != 0) {
              yaml_emitter_anchor_node(emitter,1);
              iVar3 = yaml_emitter_dump_node(emitter,1);
              if (iVar3 != 0) {
                local_88.data._40_8_ = 0;
                local_88.data.scalar.length = 0;
                local_88.data._32_8_ = 0;
                local_88.data.document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
                local_88.data.document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
                local_88.type = YAML_DOCUMENT_END_EVENT;
                local_88._4_4_ = 0;
                local_88.end_mark.line = 0;
                local_88.end_mark.column = 0;
                local_88.start_mark.column = 0;
                local_88.end_mark.index = 0;
                local_88.start_mark.index = 0;
                local_88.start_mark.line = 0;
                local_88.data._4_4_ = 0;
                local_88.data.stream_start.encoding =
                     (anon_struct_4_1_4deb52d1_for_stream_start)document->end_implicit;
                iVar3 = yaml_emitter_emit(emitter,&local_88);
                if (iVar3 != 0) {
                  yaml_emitter_delete_document_and_anchors(emitter);
                  return 1;
                }
              }
            }
          }
        }
      }
      yaml_emitter_delete_document_and_anchors(emitter);
      return 0;
    }
    __assertion = "document";
    __line = 0x76;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/dumper.c"
                ,__line,"int yaml_emitter_dump(yaml_emitter_t *, yaml_document_t *)");
}

Assistant:

YAML_DECLARE(int)
yaml_emitter_dump(yaml_emitter_t *emitter, yaml_document_t *document)
{
    yaml_event_t event;
    yaml_mark_t mark = { 0, 0, 0 };

    assert(emitter);            /* Non-NULL emitter object is required. */
    assert(document);           /* Non-NULL emitter object is expected. */

    emitter->document = document;

    if (!emitter->opened) {
        if (!yaml_emitter_open(emitter)) goto error;
    }

    if (STACK_EMPTY(emitter, document->nodes)) {
        if (!yaml_emitter_close(emitter)) goto error;
        yaml_emitter_delete_document_and_anchors(emitter);
        return 1;
    }

    assert(emitter->opened);    /* Emitter should be opened. */

    emitter->anchors = (yaml_anchors_t*)yaml_malloc(sizeof(*(emitter->anchors))
            * (document->nodes.top - document->nodes.start));
    if (!emitter->anchors) goto error;
    memset(emitter->anchors, 0, sizeof(*(emitter->anchors))
            * (document->nodes.top - document->nodes.start));

    DOCUMENT_START_EVENT_INIT(event, document->version_directive,
            document->tag_directives.start, document->tag_directives.end,
            document->start_implicit, mark, mark);
    if (!yaml_emitter_emit(emitter, &event)) goto error;

    yaml_emitter_anchor_node(emitter, 1);
    if (!yaml_emitter_dump_node(emitter, 1)) goto error;

    DOCUMENT_END_EVENT_INIT(event, document->end_implicit, mark, mark);
    if (!yaml_emitter_emit(emitter, &event)) goto error;

    yaml_emitter_delete_document_and_anchors(emitter);

    return 1;

error:

    yaml_emitter_delete_document_and_anchors(emitter);

    return 0;
}